

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O2

int absl::lts_20240722::DefaultStackUnwinder
              (void **pcs,int *sizes,int depth,int skip,void *uc,int *min_dropped_frames)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  int x;
  
  pcVar2 = UnwindImpl<false,true>;
  if (uc == (void *)0x0) {
    pcVar2 = UnwindImpl<false,false>;
  }
  pcVar3 = UnwindImpl<true,true>;
  if (uc == (void *)0x0) {
    pcVar3 = UnwindImpl<true,false>;
  }
  if (sizes == (int *)0x0) {
    pcVar3 = pcVar2;
  }
  iVar1 = (*pcVar3)();
  return iVar1;
}

Assistant:

int DefaultStackUnwinder(void** pcs, int* sizes, int depth, int skip,
                         const void* uc, int* min_dropped_frames) {
  skip++;  // For this function
  Unwinder f = nullptr;
  if (sizes == nullptr) {
    if (uc == nullptr) {
      f = &UnwindImpl<false, false>;
    } else {
      f = &UnwindImpl<false, true>;
    }
  } else {
    if (uc == nullptr) {
      f = &UnwindImpl<true, false>;
    } else {
      f = &UnwindImpl<true, true>;
    }
  }
  volatile int x = 0;
  int n = (*f)(pcs, sizes, depth, skip, uc, min_dropped_frames);
  x = 1; (void) x;  // To disable tail call to (*f)(...)
  return n;
}